

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::CommentCollector::Flush(CommentCollector *this)

{
  if (this->has_comment_ == true) {
    if (this->can_attach_to_prev_ == true) {
      if (this->prev_trailing_comments_ != (string *)0x0) {
        std::__cxx11::string::_M_append
                  ((char *)this->prev_trailing_comments_,
                   (ulong)(this->comment_buffer_)._M_dataplus._M_p);
      }
      this->has_trailing_comment_ = true;
      this->can_attach_to_prev_ = false;
    }
    else if (this->detached_comments_ !=
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this->detached_comments_,&this->comment_buffer_);
    }
    (this->comment_buffer_)._M_string_length = 0;
    *(this->comment_buffer_)._M_dataplus._M_p = '\0';
    this->has_comment_ = false;
    this->num_comments_ = this->num_comments_ + 1;
  }
  return;
}

Assistant:

void Flush() {
    if (has_comment_) {
      if (can_attach_to_prev_) {
        if (prev_trailing_comments_ != nullptr) {
          prev_trailing_comments_->append(comment_buffer_);
        }
        has_trailing_comment_ = true;
        can_attach_to_prev_ = false;
      } else {
        if (detached_comments_ != nullptr) {
          detached_comments_->push_back(comment_buffer_);
        }
      }
      ClearBuffer();
      num_comments_++;
    }
  }